

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_reader.cpp
# Opt level: O2

DATA duckdb::TemplatedListReader::Initialize(optional_ptr<duckdb::Vector,_true> result_out)

{
  list_entry_t *plVar1;
  Vector *pVVar2;
  DATA DVar3;
  optional_ptr<duckdb::Vector,_true> local_18;
  
  pVVar2 = optional_ptr<duckdb::Vector,_true>::operator*(&local_18);
  plVar1 = (list_entry_t *)pVVar2->data;
  pVVar2 = optional_ptr<duckdb::Vector,_true>::operator*(&local_18);
  FlatVector::VerifyFlatVector(pVVar2);
  DVar3.result_mask = &pVVar2->validity;
  DVar3.result_ptr = plVar1;
  return DVar3;
}

Assistant:

static DATA Initialize(optional_ptr<Vector> result_out) {
		D_ASSERT(ListVector::GetListSize(*result_out) == 0);

		auto result_ptr = FlatVector::GetData<list_entry_t>(*result_out);
		auto &result_mask = FlatVector::Validity(*result_out);
		return ListReaderData(result_ptr, result_mask);
	}